

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O3

void re2::MultithreadedSearchDFA(void)

{
  char *pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  Regexp *this;
  Prog *pPVar4;
  Thread *this_00;
  SearchThread *this_01;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  undefined4 uVar9;
  long lVar10;
  string match;
  SearchThread *t;
  string no_match;
  vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> threads;
  char *local_210 [2];
  char local_200 [16];
  Prog *local_1f0;
  SearchThread *local_1e8;
  ulong local_1e0;
  string local_1d8;
  undefined1 local_1b8 [8];
  SearchThread **ppSStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  StringPrintf_abi_cxx11_((string *)local_1b8,"0[01]{%d}$",0x12);
  local_1d8._M_dataplus._M_p = (pointer)local_1b8;
  local_1d8._M_string_length._0_4_ = (int)ppSStack_1b0;
  pcVar8 = (char *)0x794;
  this = Regexp::Parse((StringPiece *)&local_1d8,LikePerl,(RegexpStatus *)0x0);
  iVar7 = extraout_EDX;
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8);
    iVar7 = extraout_EDX_00;
  }
  if (this == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x110,3);
    pcVar8 = "Check failed: re";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ppSStack_1b0,"Check failed: re",0x10);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
    iVar7 = extraout_EDX_01;
  }
  DeBruijnString_abi_cxx11_(&local_1d8,(re2 *)pcVar8,iVar7);
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,local_1d8._M_dataplus._M_p,
             local_1d8._M_dataplus._M_p +
             CONCAT44(local_1d8._M_string_length._4_4_,(int)local_1d8._M_string_length));
  std::__cxx11::string::append((char *)local_210);
  FLAGS_re2_dfa_bail_when_slow = 0;
  pPVar4 = Regexp::CompileToProg(this,0x40000);
  if (pPVar4 == (Prog *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x118,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ppSStack_1b0,"Check failed: prog",0x12);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
  }
  this_00 = (Thread *)operator_new(0x40);
  iVar7 = (int)local_1d8._M_string_length;
  _Var2._M_p = local_1d8._M_dataplus._M_p;
  pcVar1 = local_210[1];
  pcVar8 = local_210[0];
  Thread::Thread(this_00);
  this_00->_vptr_Thread = (_func_int **)&PTR__Thread_001482d0;
  this_00[1]._vptr_Thread = (_func_int **)pPVar4;
  this_00[1].pid_ = (pthread_t)pcVar8;
  uVar9 = SUB84(pcVar1,0);
  this_00[1].running_ = (bool)(char)uVar9;
  this_00[1].joinable_ = (bool)(char)((uint)uVar9 >> 8);
  *(short *)&this_00[1].field_0x12 = (short)((uint)uVar9 >> 0x10);
  this_00[2]._vptr_Thread = (_func_int **)_Var2._M_p;
  *(int *)&this_00[2].pid_ = iVar7;
  Thread::SetJoinable(this_00,true);
  Thread::Start(this_00);
  Thread::Join(this_00);
  (*this_00->_vptr_Thread[1])(this_00);
  if (pPVar4 != (Prog *)0x0) {
    Prog::~Prog(pPVar4);
  }
  operator_delete(pPVar4);
  if (0 < FLAGS_repeat) {
    uVar6 = 0;
    do {
      pPVar4 = Regexp::CompileToProg(this,0x40000);
      if (pPVar4 == (Prog *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                   ,0x126,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ppSStack_1b0,"Check failed: prog",0x12);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
      }
      local_1b8 = (undefined1  [8])0x0;
      ppSStack_1b0 = (SearchThread **)0x0;
      local_1a8[0]._M_allocated_capacity = (SearchThread **)0x0;
      if (0 < FLAGS_threads) {
        iVar7 = 0;
        local_1f0 = pPVar4;
        local_1e0 = uVar6;
        do {
          this_01 = (SearchThread *)operator_new(0x40);
          iVar3 = (int)local_1d8._M_string_length;
          _Var2._M_p = local_1d8._M_dataplus._M_p;
          pcVar1 = local_210[1];
          pcVar8 = local_210[0];
          Thread::Thread((Thread *)this_01);
          (this_01->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_001482d0;
          this_01->prog_ = local_1f0;
          (this_01->match_).ptr_ = pcVar8;
          (this_01->match_).length_ = (int)pcVar1;
          (this_01->no_match_).ptr_ = _Var2._M_p;
          (this_01->no_match_).length_ = iVar3;
          local_1e8 = this_01;
          Thread::SetJoinable((Thread *)this_01,true);
          if (ppSStack_1b0 == (SearchThread **)local_1a8[0]._0_8_) {
            std::vector<re2::SearchThread*,std::allocator<re2::SearchThread*>>::
            _M_realloc_insert<re2::SearchThread*const&>
                      ((vector<re2::SearchThread*,std::allocator<re2::SearchThread*>> *)local_1b8,
                       (iterator)ppSStack_1b0,&local_1e8);
          }
          else {
            *ppSStack_1b0 = local_1e8;
            ppSStack_1b0 = ppSStack_1b0 + 1;
          }
          uVar6 = local_1e0;
          pPVar4 = local_1f0;
          iVar7 = iVar7 + 1;
        } while (iVar7 < FLAGS_threads);
        if (0 < FLAGS_threads) {
          lVar10 = 0;
          do {
            Thread::Start(*(Thread **)((long)local_1b8 + lVar10 * 8));
            lVar10 = lVar10 + 1;
          } while (lVar10 < FLAGS_threads);
          if (0 < FLAGS_threads) {
            lVar10 = 0;
            do {
              Thread::Join(*(Thread **)((long)local_1b8 + lVar10 * 8));
              if (*(long **)((long)local_1b8 + lVar10 * 8) != (long *)0x0) {
                (**(code **)(**(long **)((long)local_1b8 + lVar10 * 8) + 8))();
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < FLAGS_threads);
          }
        }
      }
      if (pPVar4 != (Prog *)0x0) {
        Prog::~Prog(pPVar4);
      }
      operator_delete(pPVar4);
      if (local_1b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b8);
      }
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
    } while ((int)uVar5 < FLAGS_repeat);
  }
  Regexp::Decref(this);
  if (local_210[0] != local_200) {
    operator_delete(local_210[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Multithreaded, SearchDFA) {
  // Same as single-threaded test above.
  const int n = 18;
  Regexp* re = Regexp::Parse(StringPrintf("0[01]{%d}$", n),
                             Regexp::LikePerl, NULL);
  CHECK(re);
  string no_match = DeBruijnString(n);
  string match = no_match + "0";
  FLAGS_re2_dfa_bail_when_slow = false;

  // Check that single-threaded code works.
  {
    Prog* prog = re->CompileToProg(1<<n);
    CHECK(prog);
    SearchThread* t = new SearchThread(prog, match, no_match);
    t->SetJoinable(true);
    t->Start();
    t->Join();
    delete t;
    delete prog;
  }

  // Run the search simultaneously in a bunch of threads.
  // Reuse same flags for Multithreaded.BuildDFA above.
  for (int i = 0; i < FLAGS_repeat; i++) {
    //LOG(INFO) << "Search " << i;
    Prog* prog = re->CompileToProg(1<<n);
    CHECK(prog);

    vector<SearchThread*> threads;
    for (int j = 0; j < FLAGS_threads; j++) {
      SearchThread *t = new SearchThread(prog, match, no_match);
      t->SetJoinable(true);
      threads.push_back(t);
    }
    for (int j = 0; j < FLAGS_threads; j++)
      threads[j]->Start();
    for (int j = 0; j < FLAGS_threads; j++) {
      threads[j]->Join();
      delete threads[j];
    }
    delete prog;
  }
  re->Decref();
}